

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytrie.c
# Opt level: O0

void trie_bucket_insert(tommy_trie *trie,tommy_uint_t shift,tommy_trie_node **let_ptr,
                       tommy_trie_node *insert,tommy_key_t key)

{
  long lVar1;
  tommy_node *head;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  long in_FS_OFFSET;
  uint local_54;
  tommy_uint_t j;
  tommy_uint_t i;
  void *ptr;
  tommy_trie_node *node;
  tommy_trie_tree *tree;
  tommy_key_t key_local;
  tommy_trie_node *insert_local;
  tommy_trie_node **let_ptr_local;
  tommy_uint_t shift_local;
  tommy_trie *trie_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  insert_local = (tommy_trie_node *)let_ptr;
  let_ptr_local._4_4_ = shift;
  do {
    head = insert_local->next;
    if (head == (tommy_node *)0x0) {
      tommy_list_insert_first(&insert_local->next,insert);
LAB_00109306:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return;
    }
    if (((ulong)head & 1) != 1) {
      if (head->key == key) {
        tommy_list_insert_tail_not_empty(head,insert);
      }
      else {
        while( true ) {
          pvVar4 = tommy_allocator_alloc(trie->alloc);
          trie->node_count = trie->node_count + 1;
          insert_local->next = (tommy_node_struct *)((long)pvVar4 + 1);
          for (local_54 = 0; local_54 < 8; local_54 = local_54 + 1) {
            *(undefined8 *)((long)pvVar4 + (ulong)local_54 * 8) = 0;
          }
          uVar2 = head->key >> ((byte)let_ptr_local._4_4_ & 0x1f) & 7;
          uVar3 = key >> ((byte)let_ptr_local._4_4_ & 0x1f) & 7;
          if (uVar2 != uVar3) break;
          insert_local = (tommy_trie_node *)((long)pvVar4 + (ulong)uVar2 * 8);
          let_ptr_local._4_4_ = let_ptr_local._4_4_ - 3;
        }
        *(tommy_node **)((long)pvVar4 + (ulong)uVar2 * 8) = head;
        tommy_list_insert_first((tommy_list *)((long)pvVar4 + (ulong)uVar3 * 8),insert);
      }
      goto LAB_00109306;
    }
    insert_local = (tommy_trie_node *)
                   ((long)head + ((ulong)(key >> ((byte)let_ptr_local._4_4_ & 0x1f)) & 7) * 8 + -1);
    let_ptr_local._4_4_ = let_ptr_local._4_4_ - 3;
  } while( true );
}

Assistant:

static void trie_bucket_insert(tommy_trie* trie, tommy_uint_t shift, tommy_trie_node** let_ptr, tommy_trie_node* insert, tommy_key_t key)
{
	tommy_trie_tree* tree;
	tommy_trie_node* node;
	void* ptr;
	tommy_uint_t i;
	tommy_uint_t j;

recurse:
	ptr = *let_ptr;

	/* if null, just insert the node */
	if (!ptr) {
		/* setup the node as a list */
		tommy_list_insert_first(let_ptr, insert);
		return;
	}

	if (trie_get_type(ptr) == TOMMY_TRIE_TYPE_TREE) {
		/* repeat the process one level down */
		let_ptr = &trie_get_tree(ptr)->map[(key >> shift) & TOMMY_TRIE_TREE_MASK];
		shift -= TOMMY_TRIE_TREE_BIT;
		goto recurse;
	}

	node = tommy_cast(tommy_trie_node*, ptr);

	/* if it's the same key, insert in the list */
	if (node->key == key) {
		tommy_list_insert_tail_not_empty(node, insert);
		return;
	}

expand:
	/* convert to a tree */
	tree = tommy_cast(tommy_trie_tree*, tommy_allocator_alloc(trie->alloc));
	++trie->node_count;
	*let_ptr = tommy_cast(tommy_trie_node*, trie_set_tree(tree));

	/* initialize it */
	for (i = 0; i < TOMMY_TRIE_TREE_MAX; ++i)
		tree->map[i] = 0;

	/* get the position of the two elements */
	i = (node->key >> shift) & TOMMY_TRIE_TREE_MASK;
	j = (key >> shift) & TOMMY_TRIE_TREE_MASK;

	/* if they don't collide */
	if (i != j) {
		/* insert the already existing element */
		tree->map[i] = node;

		/* insert the new node */
		tommy_list_insert_first(&tree->map[j], insert);
		return;
	}

	/* expand one more level */
	let_ptr = &tree->map[i];
	shift -= TOMMY_TRIE_TREE_BIT;
	goto expand;
}